

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O2

string * __thiscall
llvm::formatv_object_base::str_abi_cxx11_(string *__return_storage_ptr__,formatv_object_base *this)

{
  raw_string_ostream Stream;
  raw_string_ostream local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40.super_raw_ostream.BufferMode = InternalBuffer;
  local_40.super_raw_ostream.OutBufStart = (char *)0x0;
  local_40.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_40.super_raw_ostream.OutBufCur = (char *)0x0;
  local_40.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001c33b0;
  local_40.OS = __return_storage_ptr__;
  raw_ostream::operator<<(&local_40.super_raw_ostream,this);
  raw_ostream::flush(&local_40.super_raw_ostream);
  raw_string_ostream::~raw_string_ostream(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const {
    std::string Result;
    raw_string_ostream Stream(Result);
    Stream << *this;
    Stream.flush();
    return Result;
  }